

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_zip.c
# Opt level: O2

wchar_t consume_optional_marker(archive_read *a,zip *zip)

{
  zip_entry *pzVar1;
  ulong uVar2;
  wchar_t wVar3;
  uint32_t *puVar4;
  
  wVar3 = L'\0';
  if ((zip->end_of_entry != '\0') && (wVar3 = L'\0', (zip->entry->zip_flags & 8) != 0)) {
    puVar4 = (uint32_t *)__archive_read_ahead(a,0x18,(ssize_t *)0x0);
    if (puVar4 == (uint32_t *)0x0) {
      archive_set_error(&a->archive,0x54,"Truncated ZIP end-of-file record");
      wVar3 = L'\xffffffe2';
    }
    else {
      if (((((char)*puVar4 == 'P') && (*(char *)((long)puVar4 + 1) == 'K')) &&
          (*(char *)((long)puVar4 + 2) == '\a')) && (*(char *)((long)puVar4 + 3) == '\b')) {
        puVar4 = puVar4 + 1;
        zip->unconsumed = 4;
      }
      pzVar1 = zip->entry;
      pzVar1->cm_zlib_crc32 = *puVar4;
      if ((pzVar1->flags & 1) == 0) {
        pzVar1->compressed_size = (ulong)puVar4[1];
        pzVar1->uncompressed_size = (ulong)puVar4[2];
        zip->unconsumed = zip->unconsumed + 0xc;
      }
      else {
        uVar2 = *(ulong *)(puVar4 + 3);
        if ((long)(*(ulong *)(puVar4 + 1) | uVar2) < 0) {
          archive_set_error(&a->archive,0x54,"Overflow of 64-bit file sizes");
          return L'\xffffffe7';
        }
        pzVar1->compressed_size = *(ulong *)(puVar4 + 1);
        pzVar1->uncompressed_size = uVar2;
        zip->unconsumed = zip->unconsumed + 0x14;
      }
      wVar3 = L'\0';
    }
  }
  return wVar3;
}

Assistant:

static int
consume_optional_marker(struct archive_read *a, struct zip *zip)
{
	if (zip->end_of_entry && (zip->entry->zip_flags & ZIP_LENGTH_AT_END)) {
		const char *p;

		if (NULL == (p = __archive_read_ahead(a, 24, NULL))) {
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_FILE_FORMAT,
			    "Truncated ZIP end-of-file record");
			return (ARCHIVE_FATAL);
		}
		/* Consume the optional PK\007\010 marker. */
		if (p[0] == 'P' && p[1] == 'K' &&
		    p[2] == '\007' && p[3] == '\010') {
			p += 4;
			zip->unconsumed = 4;
		}
		if (zip->entry->flags & LA_USED_ZIP64) {
			uint64_t compressed, uncompressed;
			zip->entry->crc32 = archive_le32dec(p);
			compressed = archive_le64dec(p + 4);
			uncompressed = archive_le64dec(p + 12);
			if (compressed > INT64_MAX ||
			    uncompressed > INT64_MAX) {
				archive_set_error(&a->archive,
				    ARCHIVE_ERRNO_FILE_FORMAT,
				    "Overflow of 64-bit file sizes");
				return ARCHIVE_FAILED;
			}
			zip->entry->compressed_size = compressed;
			zip->entry->uncompressed_size = uncompressed;
			zip->unconsumed += 20;
		} else {
			zip->entry->crc32 = archive_le32dec(p);
			zip->entry->compressed_size = archive_le32dec(p + 4);
			zip->entry->uncompressed_size = archive_le32dec(p + 8);
			zip->unconsumed += 12;
		}
	}

    return (ARCHIVE_OK);
}